

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

Cba_Man_t * Cba_ManCollapse(Cba_Man_t *p)

{
  uint uVar1;
  int f;
  Hash_IntMan_t *vHash;
  int iVar2;
  uint i;
  int iVar3;
  Abc_Nam_t *pAVar4;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Cba_Man_t *p_00;
  Vec_Int_t *p_01;
  int *piVar5;
  Cba_Ntk_t *p_02;
  char *pcVar6;
  long lVar7;
  Cba_Ntk_t *p_03;
  long lVar8;
  int nFons;
  int nFins;
  int nObjs;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  pcVar6 = p->pSpec;
  pAVar4 = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef(p->pFuns);
  pMods = Abc_NamStart(100,0x18);
  vHash = p->vHash;
  piVar5 = &vHash->nRefs;
  *piVar5 = *piVar5 + 1;
  p_00 = Cba_ManAlloc(pcVar6,1,pAVar4,pFuns,pMods,vHash);
  iVar2 = p->iRoot;
  if (((long)iVar2 < 1) || ((p->vNtks).nSize <= iVar2)) {
    p_03 = (Cba_Ntk_t *)0x0;
  }
  else {
    p_03 = (Cba_Ntk_t *)(p->vNtks).pArray[iVar2];
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_01->pArray = piVar5;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  memcpy(p_00->pTypeNames,p->pTypeNames,0x2d0);
  Cba_ManGetClpStats(p,&local_38,&local_3c,&local_40);
  p_02 = Cba_NtkAlloc(p_00,p_03->NameId,(p_03->vInputs).nSize,(p_03->vOutputs).nSize,local_38,
                      local_3c,local_40);
  pAVar4 = p_00->pMods;
  pcVar6 = Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
  iVar2 = Abc_NamStrFindOrAdd(pAVar4,pcVar6,&local_34);
  if (local_34 == 0) {
    if (iVar2 != p_02->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x264,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
    }
  }
  else {
    Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
    printf("Network with name \"%s\" already exists.\n");
  }
  if (0 < (p_03->vObjName).nSize) {
    uVar1 = (p_02->vObjType).nCap;
    if ((p_02->vObjName).nCap < (int)uVar1) {
      piVar5 = (p_02->vObjName).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
      }
      (p_02->vObjName).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_003372ef;
      (p_02->vObjName).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p_02->vObjName).pArray,0,(ulong)uVar1 * 4);
    }
    (p_02->vObjName).nSize = uVar1;
  }
  if (0 < (p_03->vFonName).nSize) {
    uVar1 = (p_02->vFonObj).nCap;
    if ((p_02->vFonName).nCap < (int)uVar1) {
      piVar5 = (p_02->vFonName).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
      }
      (p_02->vFonName).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_003372ef;
      (p_02->vFonName).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p_02->vFonName).pArray,0,(ulong)uVar1 * 4);
    }
    (p_02->vFonName).nSize = uVar1;
  }
  if (0 < (p_03->vObjAttr).nSize) {
    uVar1 = (p_02->vObjType).nCap;
    if ((p_02->vObjAttr).nCap < (int)uVar1) {
      piVar5 = (p_02->vObjAttr).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
      }
      (p_02->vObjAttr).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_003372ef;
      (p_02->vObjAttr).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p_02->vObjAttr).pArray,0,(ulong)uVar1 * 4);
    }
    (p_02->vObjAttr).nSize = uVar1;
    if ((p_02->vAttrSto).nCap < 1) {
      piVar5 = (p_02->vAttrSto).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc(4);
      }
      else {
        piVar5 = (int *)realloc(piVar5,4);
      }
      (p_02->vAttrSto).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_003372ef;
      (p_02->vAttrSto).nCap = 1;
    }
    *(p_02->vAttrSto).pArray = -1;
    (p_02->vAttrSto).nSize = 1;
  }
  if (0 < (p_03->vObjAttr).nSize) {
    Vec_IntFillExtra(&p_03->vObjAttr,1,0);
    if ((p_03->vObjAttr).nSize < 1) {
LAB_00337254:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (*(p_03->vObjAttr).pArray != 0) {
      piVar5 = Cba_ObjAttrArray(p_03,0);
      iVar2 = Cba_ObjAttrSize(p_03,0);
      Cba_ObjSetAttrs(p_02,0,piVar5,iVar2);
    }
  }
  uVar1 = (p_03->vObjType).nCap;
  if ((p_03->vObjCopy).nCap < (int)uVar1) {
    piVar5 = (p_03->vObjCopy).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
    }
    (p_03->vObjCopy).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_003372ef:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_03->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p_03->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p_03->vObjCopy).nSize = uVar1;
  iVar2 = (p_03->vInputs).nSize;
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      iVar2 = (p_03->vInputs).pArray[lVar8];
      lVar7 = (long)iVar2;
      if (lVar7 < 1) {
LAB_00337273:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((p_03->vObjFon0).nSize <= iVar2) goto LAB_00337254;
      uVar1 = (p_03->vObjFon0).pArray[lVar7];
      i = Cba_ObjDup(p_02,p_03,iVar2);
      if ((int)i < 1) goto LAB_00337273;
      if ((p_02->vObjFon0).nSize <= (int)i) goto LAB_00337254;
      Vec_IntPush(p_01,(p_02->vObjFon0).pArray[i]);
      if (0 < (p_03->vObjName).nSize) {
        Vec_IntFillExtra(&p_03->vObjName,iVar2 + 1,0);
        if ((p_03->vObjName).nSize <= iVar2) goto LAB_00337254;
        Cba_ObjSetName(p_02,i,(p_03->vObjName).pArray[lVar7]);
      }
      if (0 < (p_03->vFonName).nSize) {
        if ((p_02->vObjFon0).nSize <= (int)i) goto LAB_00337254;
        if ((int)uVar1 < 1) goto LAB_00337292;
        iVar3 = (p_02->vObjFon0).pArray[i];
        Vec_IntFillExtra(&p_03->vFonName,uVar1 + 1,0);
        if ((p_03->vFonName).nSize <= (int)uVar1) goto LAB_00337254;
        Cba_FonSetName(p_02,iVar3,(p_03->vFonName).pArray[uVar1]);
      }
      if (0 < (p_03->vObjAttr).nSize) {
        Vec_IntFillExtra(&p_03->vObjAttr,iVar2 + 1,0);
        if ((p_03->vObjAttr).nSize <= iVar2) goto LAB_00337254;
        if ((p_03->vObjAttr).pArray[lVar7] != 0) {
          piVar5 = Cba_ObjAttrArray(p_03,iVar2);
          iVar2 = Cba_ObjAttrSize(p_03,iVar2);
          Cba_ObjSetAttrs(p_02,i,piVar5,iVar2);
        }
      }
      lVar8 = lVar8 + 1;
      iVar2 = (p_03->vInputs).nSize;
    } while (lVar8 < iVar2);
  }
  if (p_01->nSize != iVar2) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x331,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  Cba_NtkCollapse_rec(p_02,p_03,p_01);
  if (p_01->nSize != (p_03->vOutputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x333,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  if (0 < (p_03->vOutputs).nSize) {
    lVar8 = 0;
    do {
      iVar2 = (p_03->vOutputs).pArray[lVar8];
      lVar7 = (long)iVar2;
      if (lVar7 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((p_03->vObjFin0).nSize <= iVar2) goto LAB_00337254;
      iVar3 = (p_03->vObjFin0).pArray[lVar7];
      if ((long)iVar3 < 1) {
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((p_03->vFinFon).nSize <= iVar3) goto LAB_00337254;
      uVar1 = (p_03->vFinFon).pArray[iVar3];
      iVar3 = Cba_ObjDup(p_02,p_03,iVar2);
      if (p_01->nSize <= lVar8) goto LAB_00337254;
      Cba_ObjSetFinFon(p_02,iVar3,0,p_01->pArray[lVar8]);
      if (0 < (p_03->vObjName).nSize) {
        Vec_IntFillExtra(&p_03->vObjName,iVar2 + 1,0);
        if ((p_03->vObjName).nSize <= iVar2) goto LAB_00337254;
        Cba_ObjSetName(p_02,iVar3,(p_03->vObjName).pArray[lVar7]);
      }
      if (0 < (p_03->vFonName).nSize) {
        if (p_01->nSize <= lVar8) goto LAB_00337254;
        if ((int)uVar1 < 1) {
LAB_00337292:
          __assert_fail("Cba_FonIsReal(f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        f = p_01->pArray[lVar8];
        Vec_IntFillExtra(&p_03->vFonName,uVar1 + 1,0);
        if ((p_03->vFonName).nSize <= (int)uVar1) goto LAB_00337254;
        Cba_FonSetName(p_02,f,(p_03->vFonName).pArray[uVar1]);
      }
      if (0 < (p_03->vObjAttr).nSize) {
        Vec_IntFillExtra(&p_03->vObjAttr,iVar2 + 1,0);
        if ((p_03->vObjAttr).nSize <= iVar2) goto LAB_00337254;
        if ((p_03->vObjAttr).pArray[lVar7] != 0) {
          piVar5 = Cba_ObjAttrArray(p_03,iVar2);
          iVar2 = Cba_ObjAttrSize(p_03,iVar2);
          Cba_ObjSetAttrs(p_02,iVar3,piVar5,iVar2);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p_03->vOutputs).nSize);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if ((p_02->vObjType).nSize != (p_02->vObjType).nCap) {
    __assert_fail("Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x340,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  if ((p_02->vFinFon).nSize != (p_02->vFinFon).nCap) {
    __assert_fail("Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x341,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  if ((p_02->vFonObj).nSize == (p_02->vFonObj).nCap) {
    Cba_NtkMissingFonNames(p_02,"m");
    return p_00;
  }
  __assert_fail("Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                ,0x342,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
}

Assistant:

Cba_Man_t * Cba_ManCollapse( Cba_Man_t * p )
{
    Cba_Man_t * pNew  = Cba_ManAlloc( p->pSpec, 1, Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_Ntk_t * pRoot = Cba_ManRoot( p ), * pRootNew;
    Vec_Int_t * vSigs = Vec_IntAlloc( 1000 );
    int i, iObj, iObjNew, iFon, nObjs = 0, nFins = 0, nFons = 0;
    Cba_ManDupTypeNames( pNew, p );
    Cba_ManGetClpStats( p, &nObjs, &nFins, &nFons    );
    pRootNew = Cba_NtkAlloc( pNew, Cba_NtkNameId(pRoot), Cba_NtkPiNum(pRoot), Cba_NtkPoNum(pRoot), nObjs, nFins, nFons );
    Cba_NtkAdd( pNew, pRootNew );
    if ( Cba_NtkHasObjNames(pRoot) )
        Cba_NtkCleanObjNames( pRootNew );
    if ( Cba_NtkHasFonNames(pRoot) )
        Cba_NtkCleanFonNames( pRootNew );
    if ( Cba_NtkHasObjAttrs(pRoot) )
        Cba_NtkCleanObjAttrs( pRootNew );
    if ( Cba_ObjAttr(pRoot, 0) )
        Cba_ObjSetAttrs( pRootNew, 0, Cba_ObjAttrArray(pRoot, 0), Cba_ObjAttrSize(pRoot, 0) );
    Cba_NtkCleanObjCopies( pRoot );
    Cba_NtkForEachPiFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Vec_IntPush( vSigs, Cba_ObjFon0(pRootNew, iObjNew) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Cba_ObjFon0(pRootNew, iObjNew), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot) );
    Cba_NtkCollapse_rec( pRootNew, pRoot, vSigs );
    assert( Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot) );
    Cba_NtkForEachPoDriverFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Cba_ObjSetFinFon( pRootNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Vec_IntEntry(vSigs, i), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    Vec_IntFree( vSigs );
    assert( Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew) );
    assert( Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew) );
    assert( Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew) );
    // create internal node names
    Cba_NtkMissingFonNames( pRootNew, "m" );
    //Cba_NtkPrepareSeq( pRootNew );
    return pNew;
}